

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int dmrC_test_parse(void)

{
  dmr_C *C_00;
  size_t size;
  char *pcVar1;
  token *local_98;
  token *p_1;
  token *p;
  token *end;
  token *start;
  char test1 [100];
  dmr_C *C;
  
  register0x00000000 = new_dmr_C();
  memcpy(&start,
         "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }"
         ,100);
  C_00 = stack0xfffffffffffffff0;
  size = strlen((char *)&start);
  p_1 = dmrC_tokenize_buffer(C_00,(uchar *)&start,size,&p);
  end = p_1;
  for (; p_1 != &dmrC_eof_token_entry_; p_1 = p_1->next) {
    pcVar1 = dmrC_show_token(stack0xfffffffffffffff0,p_1);
    printf("%s\n",pcVar1);
  }
  printf("\n");
  local_98 = dmrC_preprocess(stack0xfffffffffffffff0,end);
  end = local_98;
  for (; local_98 != &dmrC_eof_token_entry_; local_98 = local_98->next) {
    pcVar1 = dmrC_show_token(stack0xfffffffffffffff0,local_98);
    printf("%s\n",pcVar1);
  }
  for (; end != &dmrC_eof_token_entry_;
      end = dmrC_external_declaration
                      (stack0xfffffffffffffff0,end,
                       &stack0xfffffffffffffff0->S->translation_unit_used_list,(validate_decl_t)0x0)
      ) {
  }
  dmrC_show_symbol_list
            (stack0xfffffffffffffff0,stack0xfffffffffffffff0->S->translation_unit_used_list,"\n\n");
  destroy_dmr_C(stack0xfffffffffffffff0);
  return 0;
}

Assistant:

int dmrC_test_parse() {
	struct dmr_C *C = new_dmr_C();
	char test1[100] = "extern int printf(const char *, ...); int main() { printf(\"hello world!\\n\"); return 0; }";
	struct token *start;
	struct token *end;
	start = dmrC_tokenize_buffer(C, (unsigned char *)test1,
		(unsigned long)strlen(test1), &end);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	printf("\n");
	start = dmrC_preprocess(C, start);
	for (struct token *p = start; !dmrC_eof_token(p); p = p->next) {
		printf("%s\n", dmrC_show_token(C, p));
	}
	while (!dmrC_eof_token(start))
		start = dmrC_external_declaration(C, start, &C->S->translation_unit_used_list, NULL);
	dmrC_show_symbol_list(C, C->S->translation_unit_used_list, "\n\n");
	destroy_dmr_C(C);
	return 0;
}